

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O0

CURLcode Curl_setstropt(char **charp,char *s)

{
  char *__s;
  size_t sVar1;
  size_t len;
  char *str;
  char *s_local;
  char **charp_local;
  
  (*Curl_cfree)(*charp);
  *charp = (char *)0x0;
  if (s != (char *)0x0) {
    __s = (*Curl_cstrdup)(s);
    if ((__s != (char *)0x0) && (sVar1 = strlen(__s), 8000000 < sVar1)) {
      (*Curl_cfree)(__s);
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if (__s == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *charp = __s;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_setstropt(char **charp, const char *s)
{
  /* Release the previous storage at `charp' and replace by a dynamic storage
     copy of `s'. Return CURLE_OK or CURLE_OUT_OF_MEMORY. */

  Curl_safefree(*charp);

  if(s) {
    char *str = strdup(s);

    if(str) {
      size_t len = strlen(str);
      if(len > CURL_MAX_INPUT_LENGTH) {
        free(str);
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }
    if(!str)
      return CURLE_OUT_OF_MEMORY;

    *charp = str;
  }

  return CURLE_OK;
}